

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O0

void format::read_string(ifstream *in_file,string *context,string *indent)

{
  byte bVar1;
  int iVar2;
  string *psVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  streampos oldpos;
  undefined1 local_40 [8];
  string line;
  string *indent_local;
  string *context_local;
  ifstream *in_file_local;
  
  line.field_2._8_8_ = indent;
  std::__cxx11::string::string((string *)local_40);
  do {
    while( true ) {
      bVar1 = std::ios::eof();
      if (((bVar1 ^ 0xff) & 1) == 0) goto LAB_00194489;
      auVar5 = std::istream::tellg();
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)in_file,(string *)local_40);
      psVar3 = (string *)std::__cxx11::string::size();
      iVar2 = std::__cxx11::string::compare((ulong)local_40,0,psVar3);
      if (iVar2 != 0) break;
      ltrim((string *)local_40);
      std::__cxx11::string::operator+=((string *)local_40,"\n");
      std::__cxx11::string::append((string *)context);
    }
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
  } while (*pcVar4 == '-');
  std::istream::seekg(in_file,auVar5._0_8_,auVar5._8_8_);
LAB_00194489:
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void read_string(std::ifstream &in_file, std::string &context, std::string indent = "  "){
  std::string line;
  while (!in_file.eof()){
   std::streampos oldpos = in_file.tellg();  // stores the position
   std::getline(in_file,line);
   if(line.compare(0, indent.size(), indent)){
    if(line[0] == '-') //TODO not sure if this is always true
     continue;
    in_file.seekg (oldpos);   // get back to the position
    break;
   } else{
    ltrim(line);
    line+="\n";
    context.append(line);
   }
  }
 }